

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O3

AMQP_VALUE amqpvalue_create_uint(uint32_t value)

{
  undefined4 *puVar1;
  LOGGER_LOG p_Var2;
  AMQP_VALUE pAVar3;
  
  puVar1 = (undefined4 *)malloc(0x20);
  if (puVar1 == (undefined4 *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 == (LOGGER_LOG)0x0) {
      pAVar3 = (AMQP_VALUE)0x0;
    }
    else {
      pAVar3 = (AMQP_VALUE)0x0;
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_create_uint",0x182,1,"Could not allocate memory for AMQP value");
    }
  }
  else {
    pAVar3 = (AMQP_VALUE)(puVar1 + 2);
    *puVar1 = 1;
    puVar1[2] = 5;
    puVar1[4] = value;
  }
  return pAVar3;
}

Assistant:

AMQP_VALUE amqpvalue_create_uint(uint32_t value)
{
    AMQP_VALUE result = REFCOUNT_TYPE_CREATE(AMQP_VALUE_DATA);
    if (result == NULL)
    {
        /* Codes_SRS_AMQPVALUE_01_045: [If allocating the AMQP_VALUE fails then amqpvalue_create_uint shall return NULL.] */
        LogError("Could not allocate memory for AMQP value");
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_044: [amqpvalue_create_uint shall return a handle to an AMQP_VALUE that stores an uint32_t value.] */
        result->type = AMQP_TYPE_UINT;
        result->value.uint_value = value;
    }

    return result;
}